

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_damagescreencolor_Cfs_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *text;
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  PalEntry color;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_20;
  FName local_1c;
  
  if (params[1].i == 0) {
    iVar2 = params[2].i;
  }
  else {
    iVar2 = V_GetColor((DWORD *)0x0,params[2].s,(FScriptPosition *)0x0);
  }
  local_20.d._0_3_ = (undefined3)iVar2;
  if (params->i < 3) {
    local_20.field_0.a = 0xff;
  }
  else {
    dVar3 = params[3].d;
    dVar4 = 1.0;
    if (dVar3 <= 1.0) {
      dVar4 = dVar3;
    }
    dVar3 = (double)(-(ulong)(0.0 < dVar3) & (ulong)(dVar4 * 255.0));
    if (params->i != 3) {
      text = params[4].s;
      local_20.field_0.a = (char)(int)dVar3;
      bVar1 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        FName::FName(&local_1c,text);
        TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::Insert
                  ((TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_> *)
                   &info[1].super_PClass.SpecialInits,&local_1c,(PalEntry *)&local_20.field_0);
        return;
      }
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xb3d,
                    "void Handler_damagescreencolor_Cfs_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    local_20.field_0.a = (char)(int)dVar3;
  }
  (defaults->DamageFade).field_0 = local_20;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, damagescreencolor, Cfs, PlayerPawn)
{
	PROP_COLOR_PARM(c, 0);

	PalEntry color = c;

	if (PROP_PARM_COUNT < 3)		// Because colors count as 2 parms
	{
		color.a = 255;
		defaults->DamageFade = color;
	}
	else if (PROP_PARM_COUNT < 4)
	{
		PROP_DOUBLE_PARM(a, 2);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		defaults->DamageFade = color;
	}
	else
	{
		PROP_DOUBLE_PARM(a, 2);
		PROP_STRING_PARM(type, 3);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->PainFlashes.Insert(type, color);
	}
}